

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

bool __thiscall CDBWrapper::WriteBatch(CDBWrapper *this,CDBBatch *batch,bool fSync)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  size_t sVar3;
  LevelDBContext *pLVar4;
  Logger *pLVar5;
  Level level;
  DB *pDVar6;
  CDBWrapper *category;
  double *in_R9;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string_view str;
  string_view logging_function;
  double mem_after;
  Status status;
  double mem_before;
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::LogAcceptCategory((LogFlags)this,(Level)batch);
  mem_before = 0.0;
  if (bVar2) {
    sVar3 = DynamicMemoryUsage(this);
    auVar7._8_4_ = (int)(sVar3 >> 0x20);
    auVar7._0_8_ = sVar3;
    auVar7._12_4_ = 0x45300000;
    mem_before = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625;
  }
  pLVar4 = DBContext(this);
  pDVar6 = pLVar4->pdb;
  pLVar4 = DBContext(this);
  (*pDVar6->_vptr_DB[4])
            (&status,pDVar6,&pLVar4->writeoptions + fSync,
             (batch->m_impl_batch)._M_t.
             super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl);
  level = (Level)pDVar6;
  HandleError(&status);
  if (bVar2) {
    category = this;
    sVar3 = DynamicMemoryUsage(this);
    auVar8._8_4_ = (int)(sVar3 >> 0x20);
    auVar8._0_8_ = sVar3;
    auVar8._12_4_ = 0x45300000;
    mem_after = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 0.0009765625 *
                0.0009765625;
    bVar2 = ::LogAcceptCategory((LogFlags)category,level);
    if (bVar2) {
      pLVar5 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar5);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string,double,double>
                  (&local_70,
                   (tinyformat *)"WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                   (char *)&this->m_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mem_before,
                   &mem_after,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pLVar5 = LogInstance();
        local_70._M_dataplus._M_p = (pointer)0x56;
        local_70._M_string_length = 0xca2abb;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp"
        ;
        source_file._M_len = 0x56;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "WriteBatch";
        logging_function._M_len = 10;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x12f,LEVELDB,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
  }
  leveldb::Status::~Status(&status);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::WriteBatch(CDBBatch& batch, bool fSync)
{
    const bool log_memory = LogAcceptCategory(BCLog::LEVELDB, BCLog::Level::Debug);
    double mem_before = 0;
    if (log_memory) {
        mem_before = DynamicMemoryUsage() / 1024.0 / 1024;
    }
    leveldb::Status status = DBContext().pdb->Write(fSync ? DBContext().syncoptions : DBContext().writeoptions, &batch.m_impl_batch->batch);
    HandleError(status);
    if (log_memory) {
        double mem_after = DynamicMemoryUsage() / 1024.0 / 1024;
        LogDebug(BCLog::LEVELDB, "WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                 m_name, mem_before, mem_after);
    }
    return true;
}